

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O0

bool __thiscall kratos::Param::has_param_size_var(Param *this,Var *var,uint32_t index,Var *expr)

{
  bool bVar1;
  _Self local_50;
  _Self local_48;
  undefined1 local_40 [8];
  tuple<kratos::Var_*,_unsigned_int,_kratos::Var_*> tuple;
  Var *expr_local;
  Var *pVStack_18;
  uint32_t index_local;
  Var *var_local;
  Param *this_local;
  
  tuple.super__Tuple_impl<0UL,_kratos::Var_*,_unsigned_int,_kratos::Var_*>.
  super__Head_base<0UL,_kratos::Var_*,_false>._M_head_impl = expr;
  expr_local._4_4_ = index;
  pVStack_18 = var;
  var_local = (Var *)this;
  std::make_tuple<kratos::Var*&,unsigned_int&,kratos::Var*&>
            ((tuple<kratos::Var_*,_unsigned_int,_kratos::Var_*> *)local_40,&stack0xffffffffffffffe8,
             (uint *)((long)&expr_local + 4),
             &tuple.super__Tuple_impl<0UL,_kratos::Var_*,_unsigned_int,_kratos::Var_*>.
              super__Head_base<0UL,_kratos::Var_*,_false>._M_head_impl);
  local_48._M_node =
       (_Base_ptr)
       std::
       set<std::tuple<kratos::Var_*,_unsigned_int,_kratos::Var_*>,_std::less<std::tuple<kratos::Var_*,_unsigned_int,_kratos::Var_*>_>,_std::allocator<std::tuple<kratos::Var_*,_unsigned_int,_kratos::Var_*>_>_>
       ::find(&this->param_vars_size_,(key_type *)local_40);
  local_50._M_node =
       (_Base_ptr)
       std::
       set<std::tuple<kratos::Var_*,_unsigned_int,_kratos::Var_*>,_std::less<std::tuple<kratos::Var_*,_unsigned_int,_kratos::Var_*>_>,_std::allocator<std::tuple<kratos::Var_*,_unsigned_int,_kratos::Var_*>_>_>
       ::end(&this->param_vars_size_);
  bVar1 = std::operator!=(&local_48,&local_50);
  return bVar1;
}

Assistant:

bool Param::has_param_size_var(kratos::Var *var, uint32_t index, kratos::Var *expr) const {
    auto tuple = std::make_tuple(var, index, expr);
    return param_vars_size_.find(tuple) != param_vars_size_.end();
}